

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

tuple __thiscall
pybind11::make_tuple<(pybind11::return_value_policy)1,char_const(&)[4],char_const(&)[4]>
          (pybind11 *this,char (*args_) [4],char (*args__1) [4])

{
  undefined8 uVar1;
  handle hVar2;
  long lVar3;
  cast_error *this_00;
  allocator local_91;
  array<pybind11::object,_2UL> args;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  hVar2.m_ptr = (PyObject *)PyUnicode_FromString(args_);
  args._M_elems[0].super_handle.m_ptr = (handle)(handle)hVar2.m_ptr;
  args._M_elems[1].super_handle.m_ptr = (handle)PyUnicode_FromString(args__1);
  if ((hVar2.m_ptr != (PyObject *)0x0) && (args._M_elems[1].super_handle.m_ptr != (PyObject *)0x0))
  {
    tuple::tuple((tuple *)this,2);
    lVar3 = 0;
    while( true ) {
      if (lVar3 == 0x10) {
        std::array<pybind11::object,_2UL>::~array(&args);
        return (object)(object)this;
      }
      uVar1 = *(undefined8 *)((long)&args._M_elems[0].super_handle.m_ptr + lVar3);
      *(undefined8 *)((long)&args._M_elems[0].super_handle.m_ptr + lVar3) = 0;
      if ((*(byte *)(*(long *)(*(long *)this + 8) + 0xab) & 4) == 0) break;
      *(undefined8 *)(*(long *)this + 0x18 + lVar3) = uVar1;
      lVar3 = lVar3 + 8;
    }
    __assert_fail("PyTuple_Check(result.ptr())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/benikabocha[P]py_embedded_sample/external/pybind11/include/pybind11/cast.h"
                  ,0x496,
                  "tuple pybind11::make_tuple(Args &&...) [policy = pybind11::return_value_policy::automatic_reference, Args = <const char (&)[4], const char (&)[4]>]"
                 );
  }
  this_00 = (cast_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_80,"St5tupleIJRA4_KcS2_EE",&local_91);
  detail::clean_type_id(&local_80);
  std::operator+(&local_60,"make_tuple(): unable to convert arguments of types \'",&local_80);
  std::operator+(&local_40,&local_60,"\' to Python object");
  cast_error::runtime_error(this_00,&local_40);
  __cxa_throw(this_00,&cast_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

tuple make_tuple(Args&&... args_) {
    const size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (auto &arg_value : args) {
        if (!arg_value) {
#if defined(NDEBUG)
            throw cast_error("make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)");
#else
            throw cast_error("make_tuple(): unable to convert arguments of types '" +
                (std::string) type_id<std::tuple<Args...>>() + "' to Python object");
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}